

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O1

int test_cmdline_callback_(int id,char *arg)

{
  byte bVar1;
  byte bVar2;
  test_detail_ *ptVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  void *pvVar7;
  char *pcVar8;
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  test_ *ptVar12;
  long lVar13;
  bool bVar14;
  bool bVar15;
  int local_64;
  size_t local_50;
  
  if (id < 0x53) {
LAB_00104c3b:
    bVar2 = test_list_size_;
    if (id < 0) {
      if (id == -0x7fffffff) {
        test_cmdline_callback__cold_3();
      }
      else if (id != -0x7ffffffe) {
        if (id != -0x7ffffffd) {
          return 0;
        }
        test_cmdline_callback__cold_1();
        id = (int)arg;
        goto switchD_00104be3_default;
      }
      test_cmdline_callback__cold_2();
    }
    else {
      if (id != 0) {
        if (id != 0x43) {
          if (id == 0x45) {
            test_no_exec_ = 1;
            return 0;
          }
          return 0;
        }
        goto LAB_00104ca8;
      }
      uVar11 = (ulong)((uint)test_list_size_ * 4);
      if (test_list_size_ == 1) {
        ptVar12 = test_list_;
        uVar9 = 0;
        do {
          iVar4 = strcmp(ptVar12->name,arg);
          ptVar3 = test_details_;
          if (iVar4 == 0) {
            local_64 = 1;
            if ((test_details_[uVar9 & 0xffffffff].flags & 1) == 0) {
              test_details_[uVar9 & 0xffffffff].flags = test_details_[uVar9 & 0xffffffff].flags | 1;
              test_count_ = test_count_ + 1;
            }
            goto LAB_00105017;
          }
          uVar9 = uVar9 + 1;
          ptVar12 = ptVar12 + 1;
        } while (uVar11 != uVar9);
        if (bVar2 == 0) goto LAB_00104f47;
        local_50 = test_count_;
        uVar9 = 0;
        local_64 = 0;
        do {
          pcVar8 = test_list_[uVar9].name;
          sVar5 = strlen(arg);
          for (pcVar6 = strstr(pcVar8,arg); pcVar6 != (char *)0x0; pcVar6 = strstr(pcVar6 + 1,arg))
          {
            bVar15 = true;
            bVar14 = true;
            if (pcVar6 != pcVar8) {
              pvVar7 = memchr(test_name_contains_word__word_delim,(int)pcVar6[-1],10);
              bVar14 = pvVar7 != (void *)0x0;
            }
            if (pcVar6[sVar5] != '\0') {
              pvVar7 = memchr(test_name_contains_word__word_delim,(int)pcVar6[sVar5],10);
              bVar15 = pvVar7 != (void *)0x0;
            }
            if ((bool)(bVar14 & bVar15)) {
              bVar1 = ptVar3[uVar9].flags;
              if ((bVar1 & 1) == 0) {
                ptVar3[uVar9].flags = bVar1 | 1;
                test_count_ = local_50 + 1;
                local_50 = test_count_;
              }
              local_64 = local_64 + 1;
              break;
            }
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar11);
      }
      else {
LAB_00104f47:
        local_64 = 0;
      }
      ptVar3 = test_details_;
      if (bVar2 == 1 && local_64 < 1) {
        lVar13 = 0;
        sVar10 = test_count_;
        do {
          pcVar8 = strstr(*(char **)((long)&test_list_[0].name + lVar13),arg);
          if (pcVar8 != (char *)0x0) {
            bVar2 = (&ptVar3->flags)[lVar13];
            if ((bVar2 & 1) == 0) {
              (&ptVar3->flags)[lVar13] = bVar2 | 1;
              sVar10 = sVar10 + 1;
              test_count_ = sVar10;
            }
            local_64 = local_64 + 1;
          }
          lVar13 = lVar13 + 0x10;
          uVar11 = uVar11 - 1;
        } while (uVar11 != 0);
      }
LAB_00105017:
      if (local_64 != 0) {
        return 0;
      }
    }
    test_cmdline_callback__cold_4();
switchD_00104be3_caseD_6c:
    test_list_names_();
LAB_00105053:
    exit(0);
  }
  switch(id) {
  case 99:
    if ((arg == (char *)0x0) || (iVar4 = strcmp(arg,"always"), iVar4 == 0)) {
      test_colorize_ = 1;
      return 0;
    }
    iVar4 = strcmp(arg,"never");
    if (iVar4 != 0) {
      iVar4 = strcmp(arg,"auto");
      if (iVar4 == 0) {
        return 0;
      }
      pcVar8 = arg;
      test_cmdline_callback__cold_6();
      id = (int)pcVar8;
      goto LAB_00104c3b;
    }
LAB_00104ca8:
    test_colorize_ = 0;
    break;
  case 100:
  case 0x66:
  case 0x67:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x72:
  case 0x75:
    break;
  case 0x65:
    if ((arg == (char *)0x0) || (iVar4 = strcmp(arg,"always"), iVar4 == 0)) {
      test_no_exec_ = 0;
      return 0;
    }
    iVar4 = strcmp(arg,"never");
    if (iVar4 == 0) {
      test_no_exec_ = 1;
      return 0;
    }
    iVar4 = strcmp(arg,"auto");
    if (iVar4 == 0) {
      return 0;
    }
    test_cmdline_callback__cold_8();
  case 0x73:
    test_skip_mode_ = 1;
    break;
  case 0x68:
    test_help_();
    goto LAB_00105053;
  case 0x6c:
    goto switchD_00104be3_caseD_6c;
  case 0x71:
    test_verbose_level_ = 0;
    break;
  case 0x74:
    if ((arg == (char *)0x0) || (iVar4 = strcmp(arg,"real"), iVar4 == 0)) {
      test_timer_ = 1;
    }
    else {
      iVar4 = strcmp(arg,"cpu");
      if (iVar4 != 0) {
        test_cmdline_callback__cold_7();
      }
      test_timer_ = 2;
    }
    break;
  case 0x76:
    if (arg == (char *)0x0) {
      test_verbose_level_ = test_verbose_level_ + 1;
    }
    else {
      test_verbose_level_ = atoi(arg);
    }
    break;
  case 0x77:
    test_worker_ = 1;
    test_worker_index_ = atoi(arg);
    break;
  case 0x78:
    test_xml_output_ = (FILE *)fopen(arg,"w");
    if ((FILE *)test_xml_output_ != (FILE *)0x0) {
      return 0;
    }
    test_cmdline_callback__cold_5();
    goto LAB_00104f3b;
  default:
switchD_00104be3_default:
    if (id != 0x53) {
      if (id == 0x54) {
        test_tap_ = 1;
        return 0;
      }
      return 0;
    }
LAB_00104f3b:
    test_no_summary_ = 1;
  }
  return 0;
}

Assistant:

static int
test_cmdline_callback_(int id, const char* arg)
{
    switch(id) {
        case 's':
            test_skip_mode_ = 1;
            break;

        case 'e':
            if(arg == NULL || strcmp(arg, "always") == 0) {
                test_no_exec_ = 0;
            } else if(strcmp(arg, "never") == 0) {
                test_no_exec_ = 1;
            } else if(strcmp(arg, "auto") == 0) {
                /*noop*/
            } else {
                fprintf(stderr, "%s: Unrecognized argument '%s' for option --exec.\n", test_argv0_, arg);
                fprintf(stderr, "Try '%s --help' for more information.\n", test_argv0_);
                exit(2);
            }
            break;

        case 'E':
            test_no_exec_ = 1;
            break;

        case 't':
#if defined ACUTEST_WIN_  ||  defined ACUTEST_HAS_POSIX_TIMER_
            if(arg == NULL || strcmp(arg, "real") == 0) {
                test_timer_ = 1;
#ifndef ACUTEST_WIN_
            } else if(strcmp(arg, "cpu") == 0) {
                test_timer_ = 2;
#endif
            } else {
                fprintf(stderr, "%s: Unrecognized argument '%s' for option --time.\n", test_argv0_, arg);
                fprintf(stderr, "Try '%s --help' for more information.\n", test_argv0_);
                exit(2);
            }
#endif
            break;

        case 'S':
            test_no_summary_ = 1;
            break;

        case 'T':
            test_tap_ = 1;
            break;

        case 'l':
            test_list_names_();
            exit(0);

        case 'v':
            test_verbose_level_ = (arg != NULL ? atoi(arg) : test_verbose_level_+1);
            break;

        case 'q':
            test_verbose_level_ = 0;
            break;

        case 'c':
            if(arg == NULL || strcmp(arg, "always") == 0) {
                test_colorize_ = 1;
            } else if(strcmp(arg, "never") == 0) {
                test_colorize_ = 0;
            } else if(strcmp(arg, "auto") == 0) {
                /*noop*/
            } else {
                fprintf(stderr, "%s: Unrecognized argument '%s' for option --color.\n", test_argv0_, arg);
                fprintf(stderr, "Try '%s --help' for more information.\n", test_argv0_);
                exit(2);
            }
            break;

        case 'C':
            test_colorize_ = 0;
            break;

        case 'h':
            test_help_();
            exit(0);

        case 'w':
            test_worker_ = 1;
            test_worker_index_ = atoi(arg);
            break;
        case 'x':
            test_xml_output_ = fopen(arg, "w");
            if (!test_xml_output_) {
                fprintf(stderr, "Unable to open '%s': %s\n", arg, strerror(errno));
                exit(2);
            }
            break;

        case 0:
            if(test_lookup_(arg) == 0) {
                fprintf(stderr, "%s: Unrecognized unit test '%s'\n", test_argv0_, arg);
                fprintf(stderr, "Try '%s --list' for list of unit tests.\n", test_argv0_);
                exit(2);
            }
            break;

        case TEST_CMDLINE_OPTID_UNKNOWN_:
            fprintf(stderr, "Unrecognized command line option '%s'.\n", arg);
            fprintf(stderr, "Try '%s --help' for more information.\n", test_argv0_);
            exit(2);

        case TEST_CMDLINE_OPTID_MISSINGARG_:
            fprintf(stderr, "The command line option '%s' requires an argument.\n", arg);
            fprintf(stderr, "Try '%s --help' for more information.\n", test_argv0_);
            exit(2);

        case TEST_CMDLINE_OPTID_BOGUSARG_:
            fprintf(stderr, "The command line option '%s' does not expect an argument.\n", arg);
            fprintf(stderr, "Try '%s --help' for more information.\n", test_argv0_);
            exit(2);
    }

    return 0;
}